

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

Context_conflict * build_context(MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  Context_conflict *ctx;
  StringCache *pSVar1;
  ErrorList *pEVar2;
  Buffer *pBVar3;
  
  if (m == (MOJOSHADER_malloc)0x0) {
    m = MOJOSHADER_internal_malloc;
  }
  ctx = (Context_conflict *)(*m)(0x3c0,d);
  if (ctx != (Context_conflict *)0x0) {
    if (f == (MOJOSHADER_free)0x0) {
      f = MOJOSHADER_internal_free;
    }
    memset(ctx,0,0x3c0);
    ctx->malloc = m;
    ctx->free = f;
    ctx->malloc_data = d;
    create_symbolmap(ctx,&ctx->usertypes);
    create_symbolmap(ctx,&ctx->variables);
    pSVar1 = stringcache_create(MallocBridge,FreeBridge,ctx);
    ctx->strcache = pSVar1;
    pEVar2 = errorlist_create(MallocBridge,FreeBridge,ctx);
    ctx->errors = pEVar2;
    pEVar2 = errorlist_create(MallocBridge,FreeBridge,ctx);
    ctx->warnings = pEVar2;
    pBVar3 = buffer_create(0x800,MallocBridge,FreeBridge,ctx);
    ctx->garbage = pBVar3;
    (ctx->dt_none).type = MOJOSHADER_AST_DATATYPE_NONE;
    (ctx->dt_bool).type = MOJOSHADER_AST_DATATYPE_BOOL;
    (ctx->dt_int).type = MOJOSHADER_AST_DATATYPE_INT;
    (ctx->dt_uint).type = MOJOSHADER_AST_DATATYPE_UINT;
    (ctx->dt_float).type = MOJOSHADER_AST_DATATYPE_FLOAT;
    (ctx->dt_float_snorm).type = MOJOSHADER_AST_DATATYPE_FLOAT_SNORM;
    (ctx->dt_float_unorm).type = MOJOSHADER_AST_DATATYPE_FLOAT_UNORM;
    (ctx->dt_half).type = MOJOSHADER_AST_DATATYPE_HALF;
    (ctx->dt_double).type = MOJOSHADER_AST_DATATYPE_DOUBLE;
    (ctx->dt_string).type = MOJOSHADER_AST_DATATYPE_STRING;
    (ctx->dt_sampler1d).type = MOJOSHADER_AST_DATATYPE_SAMPLER_1D;
    (ctx->dt_sampler2d).type = MOJOSHADER_AST_DATATYPE_SAMPLER_2D;
    (ctx->dt_sampler3d).type = MOJOSHADER_AST_DATATYPE_SAMPLER_3D;
    (ctx->dt_samplercube).type = MOJOSHADER_AST_DATATYPE_SAMPLER_CUBE;
    (ctx->dt_samplerstate).type = MOJOSHADER_AST_DATATYPE_SAMPLER_STATE;
    (ctx->dt_samplercompstate).type = MOJOSHADER_AST_DATATYPE_SAMPLER_COMPARISON_STATE;
    (ctx->dt_buf_bool).type = MOJOSHADER_AST_DATATYPE_BUFFER;
    (ctx->dt_buf_bool).array.base = &ctx->dt_bool;
    (ctx->dt_buf_int).type = MOJOSHADER_AST_DATATYPE_BUFFER;
    (ctx->dt_buf_int).array.base = &ctx->dt_int;
    (ctx->dt_buf_uint).type = MOJOSHADER_AST_DATATYPE_BUFFER;
    (ctx->dt_buf_uint).array.base = &ctx->dt_uint;
    (ctx->dt_buf_half).type = MOJOSHADER_AST_DATATYPE_BUFFER;
    (ctx->dt_buf_half).array.base = &ctx->dt_half;
    (ctx->dt_buf_float).type = MOJOSHADER_AST_DATATYPE_BUFFER;
    (ctx->dt_buf_float).array.base = &ctx->dt_float;
    (ctx->dt_buf_double).type = MOJOSHADER_AST_DATATYPE_BUFFER;
    (ctx->dt_buf_double).array.base = &ctx->dt_double;
    (ctx->dt_buf_float_snorm).type = MOJOSHADER_AST_DATATYPE_BUFFER;
    (ctx->dt_buf_float_snorm).array.base = &ctx->dt_float_snorm;
    (ctx->dt_buf_float_unorm).type = MOJOSHADER_AST_DATATYPE_BUFFER;
    (ctx->dt_buf_float_unorm).array.base = &ctx->dt_float_unorm;
  }
  return ctx;
}

Assistant:

static Context *build_context(MOJOSHADER_malloc m, MOJOSHADER_free f, void *d)
{
    if (!m) m = MOJOSHADER_internal_malloc;
    if (!f) f = MOJOSHADER_internal_free;

    Context *ctx = (Context *) m(sizeof (Context), d);
    if (ctx == NULL)
        return NULL;

    memset(ctx, '\0', sizeof (Context));
    ctx->malloc = m;
    ctx->free = f;
    ctx->malloc_data = d;
    //ctx->parse_phase = MOJOSHADER_PARSEPHASE_NOTSTARTED;
    create_symbolmap(ctx, &ctx->usertypes); // !!! FIXME: check for failure.
    create_symbolmap(ctx, &ctx->variables); // !!! FIXME: check for failure.
    ctx->strcache = stringcache_create(MallocBridge, FreeBridge, ctx);  // !!! FIXME: check for failure.
    ctx->errors = errorlist_create(MallocBridge, FreeBridge, ctx);  // !!! FIXME: check for failure.
    ctx->warnings = errorlist_create(MallocBridge, FreeBridge, ctx);  // !!! FIXME: check for failure.

    // !!! FIXME: this feels hacky.
    ctx->garbage = buffer_create(256*sizeof(void*),MallocBridge,FreeBridge,ctx);  // !!! FIXME: check for failure.

    ctx->dt_none.type = MOJOSHADER_AST_DATATYPE_NONE;
    ctx->dt_bool.type = MOJOSHADER_AST_DATATYPE_BOOL;
    ctx->dt_int.type = MOJOSHADER_AST_DATATYPE_INT;
    ctx->dt_uint.type = MOJOSHADER_AST_DATATYPE_UINT;
    ctx->dt_float.type = MOJOSHADER_AST_DATATYPE_FLOAT;
    ctx->dt_float_snorm.type = MOJOSHADER_AST_DATATYPE_FLOAT_SNORM;
    ctx->dt_float_unorm.type = MOJOSHADER_AST_DATATYPE_FLOAT_UNORM;
    ctx->dt_half.type = MOJOSHADER_AST_DATATYPE_HALF;
    ctx->dt_double.type = MOJOSHADER_AST_DATATYPE_DOUBLE;
    ctx->dt_string.type = MOJOSHADER_AST_DATATYPE_STRING;
    ctx->dt_sampler1d.type = MOJOSHADER_AST_DATATYPE_SAMPLER_1D;
    ctx->dt_sampler2d.type = MOJOSHADER_AST_DATATYPE_SAMPLER_2D;
    ctx->dt_sampler3d.type = MOJOSHADER_AST_DATATYPE_SAMPLER_3D;
    ctx->dt_samplercube.type = MOJOSHADER_AST_DATATYPE_SAMPLER_CUBE;
    ctx->dt_samplerstate.type = MOJOSHADER_AST_DATATYPE_SAMPLER_STATE;
    ctx->dt_samplercompstate.type = MOJOSHADER_AST_DATATYPE_SAMPLER_COMPARISON_STATE;

    #define INIT_DT_BUFFER(t) \
        ctx->dt_buf_##t.type = MOJOSHADER_AST_DATATYPE_BUFFER; \
        ctx->dt_buf_##t.buffer.base = &ctx->dt_##t;
    INIT_DT_BUFFER(bool);
    INIT_DT_BUFFER(int);
    INIT_DT_BUFFER(uint);
    INIT_DT_BUFFER(half);
    INIT_DT_BUFFER(float);
    INIT_DT_BUFFER(double);
    INIT_DT_BUFFER(float_snorm);
    INIT_DT_BUFFER(float_unorm);
    #undef INIT_DT_BUFFER

    return ctx;
}